

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_bfset_32_d(void)

{
  uint uVar1;
  sbyte sVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) != 0) {
    my_fc_handler(m68ki_cpu.s_flag | 2);
    uVar3 = m68ki_cpu.pc & m68ki_cpu.address_mask;
    m68ki_cpu.pc = m68ki_cpu.pc + 2;
    my_fc_handler(m68ki_cpu.s_flag | 2);
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar3 = pmmu_translate_addr(uVar3);
    }
    uVar1 = m68k_read_memory_16(uVar3 & m68ki_cpu.address_mask);
    uVar3 = uVar1 >> 6;
    if ((uVar1 >> 0xb & 1) != 0) {
      uVar3 = m68ki_cpu.dar[uVar3 & 7];
    }
    if ((uVar1 & 0x20) != 0) {
      uVar1 = m68ki_cpu.dar[uVar1 & 7];
    }
    uVar4 = -1 << (-(char)uVar1 & 0x1fU);
    sVar2 = (sbyte)(uVar3 & 0x1f);
    uVar5 = uVar4 << (-(sVar2 + 0x20) & 0x3fU) & 0xfffffffe;
    if ((uVar3 & 0x1f) == 0) {
      uVar5 = 0;
    }
    uVar5 = uVar4 >> sVar2 | uVar5;
    uVar4 = m68ki_cpu.dar[m68ki_cpu.ir & 7];
    m68ki_cpu.not_z_flag = uVar4 & uVar5;
    m68ki_cpu.n_flag = (uVar4 << sVar2) >> 0x18;
    m68ki_cpu.v_flag = 0;
    m68ki_cpu.c_flag = 0;
    m68ki_cpu.dar[m68ki_cpu.ir & 7] = uVar5 | uVar4;
    return;
  }
  m68ki_exception_illegal();
  return;
}

Assistant:

static void m68k_op_bfset_32_d(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		uint offset = (word2>>6)&31;
		uint width = word2;
		uint* data = &DY;
		uint64 mask;


		if(BIT_B(word2))
			offset = REG_D[offset&7];
		if(BIT_5(word2))
			width = REG_D[width&7];


		offset &= 31;
		width = ((width-1) & 31) + 1;


		mask = MASK_OUT_ABOVE_32(0xffffffff << (32 - width));
		mask = ROR_32(mask, offset);

		FLAG_N = NFLAG_32(*data<<offset);
		FLAG_Z = *data & mask;
		FLAG_V = VFLAG_CLEAR;
		FLAG_C = CFLAG_CLEAR;

		*data |= mask;

		return;
	}
	m68ki_exception_illegal();
}